

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O1

void UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  UBool useFallback;
  byte bVar1;
  UConverter *pUVar2;
  void *pvVar3;
  byte *pbVar4;
  char *pcVar5;
  byte *pbVar6;
  UConverter *pUVar7;
  UChar *pUVar8;
  int iVar9;
  int32_t *offsets;
  int *piVar10;
  uint uVar11;
  int8_t iVar12;
  char *mySource;
  char *pcVar13;
  size_t __n;
  UChar *pUVar14;
  int iVar15;
  byte *source;
  long lVar16;
  uint uVar17;
  char tempBuf [2];
  byte *local_80;
  byte *local_78;
  UConverterSharedData *local_70;
  UConverterToUnicodeArgs local_68;
  
  local_80 = (byte *)args->source;
  pUVar2 = args->converter;
  pvVar3 = pUVar2->extraInfo;
  local_78 = local_80;
  if (*(int *)((long)pvVar3 + 0x6c) != 1) {
    pUVar14 = args->target;
    pbVar4 = (byte *)args->sourceLimit;
    local_70 = *(UConverterSharedData **)(*(long *)((long)pvVar3 + 0x50) + 0x30);
    useFallback = pUVar2->useFallback;
    if (*(int *)((long)pvVar3 + 0x68) != 0) goto LAB_001b5e9e;
    if (pbVar4 <= local_80 || pUVar2->toULength != '\x01') goto LAB_001b5e1a;
    if (args->targetLimit <= pUVar14) goto LAB_001b5e1a;
    uVar17 = (uint)pUVar2->toUBytes[0];
    pUVar2->toULength = '\0';
LAB_001b5ee7:
    bVar1 = *local_80;
    local_78 = (byte *)(ulong)bVar1;
    if ((byte)(bVar1 - 0x21) < 0x5e && ((short)uVar17 + 0xdfU & 0xfe) < 0x5e) {
      local_80 = local_80 + 1;
      local_68.size = CONCAT11(bVar1,(char)uVar17 + -0x80) | 0x8000;
      iVar9 = ucnv_MBCSSimpleGetNextUChar_63(local_70,(char *)&local_68,2,useFallback);
      uVar17 = uVar17 * 0x100 + (int)local_78;
    }
    else {
      iVar9 = 0xffff;
      if ((0x5d < (byte)(bVar1 - 0x21)) &&
         ((0x1f < bVar1 || ((0x800c000U >> (bVar1 & 0x1f) & 1) == 0)))) {
        local_80 = local_80 + 1;
        uVar17 = uVar17 << 8 | (uint)bVar1;
      }
    }
LAB_001b5f94:
    if (iVar9 < 0xfffe) {
      if (args->offsets != (int32_t *)0x0) {
        iVar15 = -1;
        if (0xff < (uVar17 & 0xffff)) {
          iVar15 = -2;
        }
        *(int *)((long)args->offsets + ((long)pUVar14 - (long)args->target) * 2) =
             (iVar15 + (int)local_80) - *(int *)&args->source;
      }
      *pUVar14 = (UChar)iVar9;
      pUVar14 = pUVar14 + 1;
LAB_001b5e1a:
      pbVar6 = local_80;
      if (local_80 < pbVar4) {
        pUVar8 = args->targetLimit;
        source = local_80;
        do {
          if (pUVar8 <= pUVar14) {
            *err = U_BUFFER_OVERFLOW_ERROR;
            pbVar6 = local_80;
            break;
          }
          bVar1 = *source;
          uVar17 = (uint)bVar1;
          if (bVar1 == 0xe) {
            *(undefined1 *)((long)pvVar3 + 0x60) = 1;
            *(undefined1 *)((long)pvVar3 + 0x70) = 1;
          }
          else {
            if (bVar1 != 0xf) goto LAB_001b5e91;
            *(undefined1 *)((long)pvVar3 + 0x60) = 0;
            if (*(char *)((long)pvVar3 + 0x70) != '\0') {
              *(undefined1 *)((long)pvVar3 + 0x70) = 0;
              *err = U_ILLEGAL_ESCAPE_SEQUENCE;
              pUVar2 = args->converter;
              pUVar2->toUCallbackReason = UCNV_IRREGULAR;
              pUVar2->toUBytes[0] = '\x0f';
              args->converter->toULength = '\x01';
              args->target = pUVar14;
              args->source = (char *)(source + 1);
              return;
            }
          }
          source = source + 1;
          pbVar6 = pbVar4;
          if (source == pbVar4) break;
        } while( true );
      }
      goto LAB_001b5e75;
    }
    pUVar2 = args->converter;
    if ((uVar17 & 0xffff) < 0x100) {
      iVar12 = '\x01';
      lVar16 = 0x41;
    }
    else {
      pUVar2->toUBytes[0] = (uint8_t)(uVar17 >> 8);
      iVar12 = '\x02';
      lVar16 = 0x42;
    }
    pUVar2->toUBytes[lVar16 + -0x41] = (uint8_t)uVar17;
    pUVar2->toULength = iVar12;
    *err = (uint)(iVar9 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
    pbVar6 = local_80;
    goto LAB_001b5e75;
  }
  uVar17._0_2_ = args->size;
  uVar17._2_1_ = args->flush;
  uVar17._3_1_ = args->field_0x3;
  uVar11 = 0x38;
  if ((ushort)(undefined2)uVar17 < 0x38) {
    uVar11 = uVar17;
  }
  memcpy(&local_68,args,(ulong)(uVar11 & 0xffff));
  pbVar4 = local_78;
  local_68.size = (uint16_t)uVar11;
  local_68.converter = *(UConverter **)((long)pvVar3 + 0x50);
  if (*(int *)((long)pvVar3 + 0x68) != 0) goto LAB_001b5dfd;
  do {
    if (U_ZERO_ERROR < *err) {
      return;
    }
    local_68.source = args->source;
    pcVar5 = args->sourceLimit;
    pcVar13 = local_68.source;
    if (pcVar5 <= local_68.source) {
      return;
    }
    do {
      local_68.sourceLimit = pcVar13;
      if (*pcVar13 == '\x1b') break;
      pcVar13 = pcVar13 + 1;
      local_68.sourceLimit = pcVar5;
    } while (pcVar13 != pcVar5);
    if (local_68.source != local_68.sourceLimit) {
      __n = (size_t)args->converter->toULength;
      if (0 < (long)__n) {
        memcpy((local_68.converter)->toUBytes,args->converter->toUBytes,__n);
      }
      (local_68.converter)->toULength = args->converter->toULength;
      ucnv_MBCSToUnicodeWithOffsets_63(&local_68,err);
      pUVar2 = local_68.converter;
      piVar10 = args->offsets;
      if (((piVar10 != (int *)0x0) && (pbVar6 = (byte *)args->source, pbVar4 != pbVar6)) &&
         (pUVar14 = args->target, pUVar14 < local_68.target)) {
        do {
          if (-1 < *piVar10) {
            *piVar10 = *piVar10 + ((int)pbVar6 - (int)pbVar4);
          }
          piVar10 = piVar10 + 1;
          pUVar14 = pUVar14 + 1;
        } while (pUVar14 < local_68.target);
      }
      args->source = local_68.source;
      args->target = local_68.target;
      args->offsets = local_68.offsets;
      if (0 < (long)(local_68.converter)->toULength) {
        memcpy(args->converter->toUBytes,(local_68.converter)->toUBytes,
               (long)(local_68.converter)->toULength);
      }
      pUVar7 = args->converter;
      pUVar7->toULength = pUVar2->toULength;
      if (*err == U_BUFFER_OVERFLOW_ERROR) {
        if (0 < (long)pUVar2->UCharErrorBufferLength) {
          memcpy(pUVar7->UCharErrorBuffer,pUVar2->UCharErrorBuffer,
                 (long)pUVar2->UCharErrorBufferLength);
        }
        args->converter->UCharErrorBufferLength = pUVar2->UCharErrorBufferLength;
        pUVar2->UCharErrorBufferLength = '\0';
      }
    }
    if (U_ZERO_ERROR < *err) {
      return;
    }
    if (args->source == args->sourceLimit) {
      return;
    }
LAB_001b5dfd:
    changeState_2022(args->converter,&args->source,args->sourceLimit,ISO_2022_KR,err);
  } while( true );
LAB_001b5e91:
  local_80 = source;
  if (bVar1 != 0x1b) goto LAB_001b5ec7;
LAB_001b5e9e:
  *(undefined1 *)((long)pvVar3 + 0x70) = 0;
  changeState_2022(args->converter,(char **)&local_80,(char *)pbVar4,ISO_2022_KR,err);
  pbVar6 = local_80;
  if (U_ZERO_ERROR < *err) goto LAB_001b5e75;
  goto LAB_001b5e1a;
LAB_001b5ec7:
  local_80 = source + 1;
  *(undefined1 *)((long)pvVar3 + 0x70) = 0;
  if (*(char *)((long)pvVar3 + 0x60) != '\x01') {
    iVar9 = 0xffff;
    if (-1 < (char)bVar1) {
      iVar9 = ucnv_MBCSSimpleGetNextUChar_63(local_70,(char *)source,1,useFallback);
    }
    goto LAB_001b5f94;
  }
  if (pbVar4 <= local_80) {
    args->converter->toUBytes[0] = bVar1;
    args->converter->toULength = '\x01';
    pbVar6 = local_80;
LAB_001b5e75:
    local_80 = pbVar6;
    args->target = pUVar14;
    args->source = (char *)local_80;
    return;
  }
  goto LAB_001b5ee7;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    UChar mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    UConverterSharedData* sharedData ;
    UBool useFallback;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    if(myData->version==1){
        UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize state */
    sharedData = myData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        goto getTrailByte;
    }

    while(mySource< mySourceLimit){

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            if(mySourceChar==UCNV_SI){
                myData->toU2022State.g = 0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                /*consume the source */
                continue;
            }else if(mySourceChar==UCNV_SO){
                myData->toU2022State.g = 1;
                myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                /*consume the source */
                continue;
            }else if(mySourceChar==ESC_2022){
                mySource--;
escape:
                myData->isEmptySegment = FALSE;	/* Any invalid ESC sequences will be detected separately, so just reset this */
                changeState_2022(args->converter,&(mySource),
                                mySourceLimit, ISO_2022_KR, err);
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;
            }

            myData->isEmptySegment = FALSE;	/* Any invalid char errors will be detected separately, so just reset this */
            if(myData->toU2022State.g == 1) {
                if(mySource < mySourceLimit) {
                    int leadIsOk, trailIsOk;
                    uint8_t trailByte;
getTrailByte:
                    targetUniChar = missingCharMarker;
                    trailByte = (uint8_t)*mySource;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                     * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        ++mySource;
                        tempBuf[0] = (char)(mySourceChar + 0x80);
                        tempBuf[1] = (char)(trailByte + 0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, tempBuf, 2, useFallback);
                        mySourceChar = (mySourceChar << 8) | trailByte;
                    } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        ++mySource;
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar = static_cast<UChar>(0x10000 | (mySourceChar << 8) | trailByte);
                    }
                } else {
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    break;
                }
            }
            else if(mySourceChar <= 0x7f) {
                targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, mySource - 1, 1, useFallback);
            } else {
                targetUniChar = 0xffff;
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else {
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    args->target = myTarget;
    args->source = mySource;
}